

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O2

Int64Value * google::protobuf::Arena::CreateMaybeMessage<google::protobuf::Int64Value>(Arena *arena)

{
  Int64Value *this;
  
  if (arena == (Arena *)0x0) {
    this = (Int64Value *)operator_new(0x20);
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
    this->value_ = 0;
    (this->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__Int64Value_003e4808;
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  }
  else {
    AllocHook(arena,(type_info *)&Int64Value::typeinfo,0x20);
    this = (Int64Value *)AllocateAlignedNoHook(arena,0x20);
    Int64Value::Int64Value(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::Int64Value* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::Int64Value >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::Int64Value >(arena);
}